

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpkyt(fitsfile *fptr,char *keyname,long intval,double fraction,char *comm,int *status)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *in_RCX;
  int *in_R8;
  char *in_XMM0_Qa;
  char *cptr;
  char fstring [71];
  char card [81];
  char valstring [71];
  int *in_stack_fffffffffffffeb8;
  int *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  double in_stack_fffffffffffffed8;
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  char local_88 [64];
  int *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  int local_4;
  
  if (*in_R8 < 1) {
    if ((1.0 < (double)in_XMM0_Qa) || ((double)in_XMM0_Qa < 0.0)) {
      ffpmsg((char *)0x23cb1c);
      *in_R8 = 0x192;
      local_4 = 0x192;
    }
    else {
      ffi2c((LONGLONG)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
            in_stack_fffffffffffffeb8);
      ffd2f(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8,
            in_stack_fffffffffffffec0);
      __s = strchr(&stack0xfffffffffffffec8,0x2e);
      sVar1 = strlen(local_88);
      sVar2 = strlen(__s);
      if (sVar1 + sVar2 < 0x47) {
        strcat(local_88,__s);
        ffmkky(in_XMM0_Qa,in_RCX,(char *)in_R8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        ffprec(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        local_4 = *in_R8;
      }
      else {
        ffpmsg((char *)0x23cbc2);
        *in_R8 = 0x192;
        local_4 = 0x192;
      }
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffpkyt( fitsfile *fptr,      /* I - FITS file pointer        */
            const char  *keyname,/* I - name of keyword to write */
            long  intval,        /* I - integer part of value    */
            double fraction,     /* I - fractional part of value */
            const char  *comm,   /* I - keyword comment          */
            int   *status)       /* IO - error status            */
/*
  Write (put) a 'triple' precision keyword where the integer and
  fractional parts of the value are passed in separate parameters to
  increase the total amount of numerical precision.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];
    char fstring[FLEN_VALUE], *cptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (fraction > 1. || fraction < 0.)
    {
        ffpmsg("fraction must be between 0. and 1. (ffpkyt)");
        return(*status = BAD_F2C);
    }

    ffi2c(intval, valstring, status);  /* convert integer to string */
    ffd2f(fraction, 16, fstring, status);  /* convert to 16 decimal string */

    cptr = strchr(fstring, '.');    /* find the decimal point */
    if (strlen(valstring)+strlen(cptr) > FLEN_VALUE-1)
    {
       ffpmsg("converted numerical string too long");
       return(*status=BAD_F2C);
    }
    strcat(valstring, cptr);    /* append the fraction to the integer */

    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffprec(fptr, card, status);  /* write the keyword*/

    return(*status);
}